

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

int metacall_load_from_file(char *tag,char **paths,size_t size,void **handle)

{
  void *__ptr;
  void **in_RDX;
  size_t in_RSI;
  loader_path *in_RDI;
  int result;
  size_t iterator;
  loader_path *path_impl;
  undefined8 local_38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDX == (void **)0x0) {
    iVar1 = 1;
  }
  else {
    __ptr = malloc((long)in_RDX << 0xc);
    if (__ptr == (void *)0x0) {
      iVar1 = 1;
    }
    else {
      for (local_38 = (void **)0x0; local_38 < in_RDX; local_38 = (void **)((long)local_38 + 1)) {
        strncpy((char *)((long)__ptr + (long)local_38 * 0x1000),
                *(char **)(in_RSI + (long)local_38 * 8),0x1000);
      }
      iVar1 = loader_load_from_file
                        ((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,in_RSI,in_RDX);
      free(__ptr);
    }
  }
  return iVar1;
}

Assistant:

int metacall_load_from_file(const char *tag, const char *paths[], size_t size, void **handle)
{
	loader_path *path_impl;
	size_t iterator;

	if (size == 0)
	{
		return 1;
	}

	path_impl = (loader_path *)malloc(sizeof(loader_path) * size);

	if (path_impl == NULL)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		strncpy(path_impl[iterator], paths[iterator], LOADER_PATH_SIZE);
	}

	int result = loader_load_from_file(tag, (const loader_path *)path_impl, size, handle);

	free(path_impl);

	return result;
}